

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer_linux.hpp
# Opt level: O0

__pid_t __thiscall Fossilize::ExternalReplayer::Impl::wait(Impl *this,void *__stat_loc)

{
  __pid_t _Var1;
  ulong uVar2;
  int *piVar3;
  int local_98;
  int local_94;
  int i;
  int r;
  int r_1;
  char dummy;
  Progress progress;
  Impl *this_local;
  
  progress._104_8_ = this;
  if (this->pid == -1) {
    this_local._4_4_ = wstatus_to_return(this->wstatus,(bool)(this->synthesized_exit_code & 1));
  }
  else {
    memset(&r_1,0,0x70);
    poll_progress(this,(Progress *)&r_1);
    if (-1 < this->child_fd) {
      uVar2 = read(this->child_fd,(void *)((long)&r + 3),1);
      if ((int)uVar2 < 0) {
        fprintf(_stderr,"Fossilize ERROR: Failed to wait for child process to end.\n");
      }
      else if (0 < (int)uVar2) {
        fprintf(_stderr,"Fossilize ERROR: Unexpected return for child process, %d.\n",
                uVar2 & 0xffffffff);
      }
      close(this->child_fd);
      this->child_fd = -1;
    }
    _Var1 = waitpid(this->pid,&this->wstatus,1);
    if (_Var1 == 0) {
      local_94 = 0;
      for (local_98 = 0; local_98 < 100 && local_94 == 0; local_98 = local_98 + 1) {
        usleep(1000);
        local_94 = waitpid(this->pid,&this->wstatus,1);
        if (local_94 < 0) {
          piVar3 = __errno_location();
          this->wstatus = -*piVar3;
          this->synthesized_exit_code = true;
        }
      }
      if (local_94 == 0) {
        fprintf(_stderr,"Fossilize WARN: waitpid loop timed out.\n");
        this->wstatus = 0;
        this->synthesized_exit_code = true;
      }
    }
    else if (_Var1 < 0) {
      fprintf(_stderr,"Fossilize WARN: Child has already been reaped.\n");
      piVar3 = __errno_location();
      this->wstatus = -*piVar3;
      this->synthesized_exit_code = true;
    }
    poll_progress(this,(Progress *)&r_1);
    reset_pid(this);
    this_local._4_4_ = wstatus_to_return(this->wstatus,(bool)(this->synthesized_exit_code & 1));
  }
  return this_local._4_4_;
}

Assistant:

int ExternalReplayer::Impl::wait()
{
	if (pid == -1)
		return wstatus_to_return(wstatus, synthesized_exit_code);

	// Pump the fifo through.
	ExternalReplayer::Progress progress = {};
	poll_progress(progress);

#if 0
	// FIXME: This code should be correct. Investigate why it seems to cause stability issues.
	for (;;)
	{
		if (waitpid(pid, &wstatus, 0) < 0)
		{
			LOGE("waitpid failed! errno = %d.\n", errno);
			wstatus = -errno;
			synthesized_exit_code = true;
			break;
		}

		// Child process can receive SIGCONT/SIGSTOP which is benign.
		if (WIFEXITED(wstatus) || WIFSIGNALED(wstatus))
			break;
	}
#else
	// The normal approach here is to use waitpid and block until completion
	// but that approach appears to have some stability issues.
	// The theory is that a parent process might be calling waitpid(-1, NOWAIT) in a thread or signal handler
	// which could confuse things.
	// Instead, use child_fd as a canary for when the child process tree dies.
	if (child_fd >= 0)
	{
		char dummy;
		int r = ::read(child_fd, &dummy, sizeof(dummy));
		if (r < 0)
			LOGE("Failed to wait for child process to end.\n");
		else if (r > 0)
			LOGE("Unexpected return for child process, %d.\n", r);
		close(child_fd);
		child_fd = -1;
	}

	int r = waitpid(pid, &wstatus, WNOHANG);
	if (r == 0)
	{
		// There is a race between the last reference to child_fd being closed
		// and SIGCHLD being delivered.
		// Unfortunately, there is no robust way to poll for waitpid with a timeout
		// (outside of the very recent pidfd in Linux 5.x+),
		// so do it in a dumb way ... We should receive the wstatus shortly.
		for (int i = 0; i < 100 && r == 0; i++)
		{
			usleep(1000);
			r = waitpid(pid, &wstatus, WNOHANG);
			if (r < 0)
			{
				wstatus = -errno;
				synthesized_exit_code = true;
			}
		}

		if (r == 0)
		{
			LOGW("waitpid loop timed out.\n");
			wstatus = 0;
			synthesized_exit_code = true;
		}
	}
	else if (r < 0)
	{
		// Could happen if process has set SIG_IGN or NOCLDWAIT for SIGCHLD.
		LOGW("Child has already been reaped.\n");
		wstatus = -errno;
		synthesized_exit_code = true;
	}
#endif

	// Pump the fifo through.
	poll_progress(progress);
	reset_pid();
	return wstatus_to_return(wstatus, synthesized_exit_code);
}